

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

string * __thiscall
AmpIO::GetQLASerialNumber_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this,uchar chan)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  uint8_t *data_00;
  size_t i;
  long lVar4;
  uint8_t data [20];
  int local_48;
  char local_44 [8];
  undefined1 local_3c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  lVar4 = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_3c = 0;
  do {
    data_00 = (uint8_t *)(local_44 + lVar4 + -4);
    bVar2 = FpgaIO::PromReadByte25AA128(&this->super_FpgaIO,(uint16_t)lVar4,data_00,chan);
    if (!bVar2) {
      if (chan == '\0') {
        poVar3 = (ostream *)&std::cerr;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "AmpIO::GetQLASerialNumber: failed to get QLA Serial Number",0x3a);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"AmpIO::GetQLASerialNumber: failed to get QLA ",0x2d);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," Serial Number",0xe);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      }
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      break;
    }
    if (*data_00 == 0xff) {
      *data_00 = '\0';
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xc);
  if ((local_48 == 0x20415264) || (local_48 == 0x20414c51)) {
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(local_44);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)local_44);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AmpIO::GetQLASerialNumber(unsigned char chan)
{
    // Format: QLA 1234-56 or QLA 1234-567.
    // String is terminated by 0 or 0xff.
    uint16_t address = 0x0000;
    uint8_t data[20];
    const size_t QLASNSize = 12;
    std::string sn;

    data[QLASNSize] = 0;  // make sure null-terminated
    for (size_t i = 0; i < QLASNSize; i++) {
        if (!PromReadByte25AA128(address, data[i], chan)) {
            if (chan == 0)
                std::cerr << "AmpIO::GetQLASerialNumber: failed to get QLA Serial Number" << std::endl;
            else
                std::cerr << "AmpIO::GetQLASerialNumber: failed to get QLA " << static_cast<unsigned int>(chan)
                          << " Serial Number" << std::endl;
            break;
        }
        if (data[i] == 0xff)
            data[i] = 0;
        address += 1;
    }
    if (strncmp((char *)data, "QLA ", 4) == 0 || strncmp((char *)data, "dRA ", 4) == 0)
        sn.assign((char *)data+4);
    return sn;
}